

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask16_32(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0x10 | *out;
  puVar1 = out + 1;
  *puVar1 = in[2];
  *puVar1 = in[3] << 0x10 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[4];
  *puVar1 = in[5] << 0x10 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[6];
  *puVar1 = in[7] << 0x10 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[8];
  *puVar1 = in[9] << 0x10 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[10];
  *puVar1 = in[0xb] << 0x10 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[0xc];
  *puVar1 = in[0xd] << 0x10 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[0xe];
  *puVar1 = in[0xf] << 0x10 | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[0x10];
  *puVar1 = in[0x11] << 0x10 | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[0x12];
  *puVar1 = in[0x13] << 0x10 | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[0x14];
  *puVar1 = in[0x15] << 0x10 | *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = in[0x16];
  *puVar1 = in[0x17] << 0x10 | *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = in[0x18];
  *puVar1 = in[0x19] << 0x10 | *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = in[0x1a];
  *puVar1 = in[0x1b] << 0x10 | *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = in[0x1c];
  *puVar1 = in[0x1d] << 0x10 | *puVar1;
  puVar1 = out + 0xf;
  *puVar1 = in[0x1e];
  *puVar1 = in[0x1f] << 0x10 | *puVar1;
  return out + 0x10;
}

Assistant:

uint32_t *__fastpackwithoutmask16_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;

  return out;
}